

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * Lowerer::HoistSymOffset
                  (Instr *instr,SymOpnd *symOpnd,RegNum baseReg,uint32 offset,RegNum regNum)

{
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  Instr *pIVar1;
  
  baseOpnd = IR::RegOpnd::New((StackSym *)0x0,baseReg,TyUint64,instr->m_func);
  indirOpnd = IR::IndirOpnd::New(baseOpnd,offset,(symOpnd->super_Opnd).m_type,instr->m_func,false);
  if ((SymOpnd *)instr->m_dst == symOpnd) {
    IR::Instr::ReplaceDst(instr,&indirOpnd->super_Opnd);
  }
  else {
    IR::Instr::ReplaceSrc(instr,&symOpnd->super_Opnd,&indirOpnd->super_Opnd);
  }
  pIVar1 = HoistIndirOffset(instr,indirOpnd,regNum);
  return pIVar1;
}

Assistant:

IR::Instr *Lowerer::HoistSymOffset(IR::Instr *instr, IR::SymOpnd *symOpnd, RegNum baseReg, uint32 offset, RegNum regNum)
{
    IR::RegOpnd *baseOpnd = IR::RegOpnd::New(nullptr, baseReg, TyMachPtr, instr->m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(baseOpnd, offset, symOpnd->GetType(), instr->m_func);
    if (symOpnd == instr->GetDst())
    {
        instr->ReplaceDst(indirOpnd);
    }
    else
    {
        instr->ReplaceSrc(symOpnd, indirOpnd);
    }

    return Lowerer::HoistIndirOffset(instr, indirOpnd, regNum);
}